

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layer.c
# Opt level: O1

size_t layer_data_init(layer_t *l,data_val_t *buf,int level)

{
  data_val_t *pdVar1;
  size_t sVar2;
  
  sVar2 = data_init(&l->in,buf,level,l->n->batch);
  pdVar1 = buf + sVar2;
  sVar2 = data_init(&l->weight,pdVar1,level,1);
  pdVar1 = pdVar1 + sVar2;
  sVar2 = data_init(&l->bias,pdVar1,level,1);
  pdVar1 = pdVar1 + sVar2;
  sVar2 = data_init(&l->extra,pdVar1,0,1);
  data_init(&l->out,pdVar1 + sVar2,level,l->n->batch);
  layer_fill_data(&l->weight_filler,&l->weight,(l->in).size,(l->out).size);
  layer_fill_data(&l->bias_filler,&l->bias,(l->in).size,(l->out).size);
  return (long)(pdVar1 + sVar2) - (long)buf >> 2;
}

Assistant:

size_t layer_data_init(layer_t *l, data_val_t *buf, int level)
{
	data_val_t *start = buf;

	buf += data_init(&l->in, buf, level, l->n->batch);
	buf += data_init(&l->weight, buf, level, 1);
	buf += data_init(&l->bias, buf, level, 1);
	buf += data_init(&l->extra, buf, 0, 1);
	/*  buf += */ data_init(&l->out, buf, level, l->n->batch);

	layer_fill_data(&l->weight_filler, &l->weight, l->in.size, l->out.size);
	layer_fill_data(&l->bias_filler, &l->bias, l->in.size, l->out.size);

	return buf - start;
}